

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

double bsc_costs_std_2tree_get(bsc_group_t group,bsc_coll_params_t *set,bsc_size_t n)

{
  int iVar1;
  double dVar2;
  double local_48;
  int local_3c;
  double local_38;
  double one_phase;
  bsc_pid_t P;
  group_t *g;
  bsc_size_t i;
  bsc_size_t n_local;
  bsc_coll_params_t *set_local;
  bsc_group_t group_local;
  
  if (group == (bsc_group_t)0x0) {
    local_3c = bsp_nprocs();
  }
  else {
    local_3c = *group;
  }
  local_38 = bsc_L(BSC_GET);
  for (g._0_4_ = 0; (int)g < n; g._0_4_ = (int)g + 1) {
    dVar2 = bsc_g(BSC_GET,set[(int)g].size);
    local_38 = dVar2 * (double)set[(int)g].size + local_38;
  }
  if (local_3c == 1) {
    local_48 = 0.0;
  }
  else {
    iVar1 = uint32_log2(local_3c - 1);
    local_48 = (double)(iVar1 + 1) * local_38;
  }
  return local_48;
}

Assistant:

double bsc_costs_std_2tree_get(  bsc_group_t group,
         bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    double one_phase = bsc_L(BSC_GET);
    for ( i = 0; i < n ; ++i )
        one_phase += bsc_g(BSC_GET, set[i].size) * set[i].size;

    return P==1?0:(int_log2(P-1)+1) * one_phase ;
}